

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void copywithendian(char *dest,char *src,int size,int islittle)

{
  int local_1c;
  int islittle_local;
  int size_local;
  char *src_local;
  char *dest_local;
  
  if (islittle == 1) {
    memcpy(dest,src,(long)size);
  }
  else {
    local_1c = size;
    _islittle_local = src;
    src_local = dest + (size + -1);
    while (local_1c != 0) {
      *src_local = *_islittle_local;
      local_1c = local_1c + -1;
      _islittle_local = _islittle_local + 1;
      src_local = src_local + -1;
    }
  }
  return;
}

Assistant:

static void copywithendian (char *dest, const char *src,
                            int size, int islittle) {
  if (islittle == nativeendian.little)
    memcpy(dest, src, size);
  else {
    dest += size - 1;
    while (size-- != 0)
      *(dest--) = *(src++);
  }
}